

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall
correctness_comparisons_Test::~correctness_comparisons_Test(correctness_comparisons_Test *this)

{
  void *in_RDI;
  
  ~correctness_comparisons_Test((correctness_comparisons_Test *)0x127398);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(correctness, comparisons)
{
    big_integer a = 100;
    big_integer b = 100;
    big_integer c = 200;

    EXPECT_TRUE(a == b);
    EXPECT_TRUE(a != c);
    EXPECT_TRUE(a < c);
    EXPECT_TRUE(c > a);
    EXPECT_TRUE(a <= a);
    EXPECT_TRUE(a <= b);
    EXPECT_TRUE(a <= c);
    EXPECT_TRUE(c >= a);
}